

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O3

void __thiscall imrt::ACO::initializePheromone(ACO *this)

{
  Collimator *this_00;
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  pair<int,_int> pVar4;
  pair<int,_int> pVar5;
  int i;
  long lVar6;
  int r;
  long lVar7;
  double dVar8;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  mpheromone;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  mprobability;
  key_type_conflict local_dc;
  long local_d8;
  Matrix local_d0;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *local_c0;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *local_b8;
  vector<maths::Matrix,_std::allocator<maths::Matrix>_> *local_b0;
  vector<maths::Matrix,_std::allocator<maths::Matrix>_> *local_a8;
  long local_a0;
  double local_98;
  _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  local_60;
  
  iVar1 = Collimator::getNbAngles(this->collimator);
  if (0 < iVar1) {
    local_a8 = &this->ipheromone;
    local_b0 = &this->iprobability;
    local_b8 = &this->pheromone;
    local_c0 = &this->probability;
    local_d8 = 0;
    do {
      local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_90._M_impl.super__Rb_tree_header._M_header;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      iVar1 = this->max_apertures;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar2 = Collimator::getIntensityLevelSize(this->collimator);
      maths::Matrix::Matrix(&local_d0,iVar1,iVar2);
      std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::emplace_back<maths::Matrix>
                (local_a8,&local_d0);
      maths::Matrix::~Matrix(&local_d0);
      iVar1 = this->max_apertures;
      iVar2 = Collimator::getIntensityLevelSize(this->collimator);
      maths::Matrix::Matrix(&local_d0,iVar1,iVar2);
      std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::emplace_back<maths::Matrix>
                (local_b0,&local_d0);
      maths::Matrix::~Matrix(&local_d0);
      local_dc = 0;
      if (0 < this->max_apertures) {
        local_a0 = local_d8 << 4;
        lVar6 = 0;
        do {
          while( true ) {
            iVar1 = Collimator::getIntensityLevelSize(this->collimator);
            if (iVar1 <= lVar6) break;
            *(double *)
             (*(long *)(*(long *)((long)&((this->ipheromone).
                                          super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p + local_a0)
                       + (long)local_dc * 8) + lVar6 * 8) = this->initial_pheromone;
            lVar6 = lVar6 + 1;
          }
          iVar1 = Collimator::getXdim(this->collimator);
          iVar2 = Collimator::getReferenceSize(this->collimator);
          maths::Matrix::Matrix(&local_d0,iVar1,iVar2);
          pmVar3 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                 *)&local_90,&local_dc);
          maths::Matrix::operator=(pmVar3,&local_d0);
          maths::Matrix::~Matrix(&local_d0);
          iVar1 = Collimator::getXdim(this->collimator);
          iVar2 = Collimator::getReferenceSize(this->collimator);
          maths::Matrix::Matrix(&local_d0,iVar1,iVar2);
          pmVar3 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                 *)&local_60,&local_dc);
          maths::Matrix::operator=(pmVar3,&local_d0);
          maths::Matrix::~Matrix(&local_d0);
          lVar6 = 0;
          while( true ) {
            iVar1 = Collimator::getXdim(this->collimator);
            if (iVar1 <= lVar6) break;
            this_00 = this->collimator;
            iVar1 = Collimator::getAngle(this_00,(int)local_d8);
            pVar4 = Collimator::getActiveRange(this_00,(int)lVar6,iVar1);
            lVar7 = 0;
            while( true ) {
              iVar1 = Collimator::getReferenceSize(this->collimator);
              if (iVar1 <= lVar7) break;
              pVar5 = Collimator::getReference(this->collimator,(int)lVar7);
              if ((pVar5.first < pVar4.first) || (pVar4.second < pVar5.second)) {
                pmVar3 = std::
                         map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                         ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                       *)&local_90,&local_dc);
                dVar8 = 0.0;
              }
              else {
                local_98 = this->initial_pheromone;
                pmVar3 = std::
                         map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                         ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                       *)&local_90,&local_dc);
                dVar8 = local_98;
              }
              pmVar3->p[lVar6][lVar7] = dVar8;
              lVar7 = lVar7 + 1;
            }
            lVar6 = lVar6 + 1;
          }
          local_dc = local_dc + 1;
          lVar6 = 0;
        } while (local_dc < this->max_apertures);
      }
      std::
      vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
      ::push_back(local_b8,(value_type *)&local_90);
      std::
      vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
      ::push_back(local_c0,(value_type *)&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::~_Rb_tree(&local_90);
      lVar6 = local_d8 + 1;
      iVar1 = Collimator::getNbAngles(this->collimator);
      local_d8 = lVar6;
    } while (lVar6 < iVar1);
  }
  return;
}

Assistant:

void initializePheromone () {
    pair <int,int> aux, raux;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      map<int, Matrix> mpheromone;
      map<int, Matrix> mprobability;
      ipheromone.push_back(Matrix(max_apertures,  collimator.getIntensityLevelSize()));
      iprobability.push_back(Matrix(max_apertures,  collimator.getIntensityLevelSize()));
      for (int a=0; a< max_apertures; a++) {
        // Intensity initial pheromones
        for (int i=0; i< collimator.getIntensityLevelSize(); i++){
          ipheromone[s](a,i) = initial_pheromone;
        }
        // Aperture initial pheromones
        mpheromone[a] = Matrix(collimator.getXdim(), collimator.getReferenceSize());
        mprobability[a] = Matrix(collimator.getXdim(), collimator.getReferenceSize());
        for (int j = 0; j < collimator.getXdim(); j++) {
          aux = collimator.getActiveRange(j, collimator.getAngle(s));
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            raux = collimator.getReference(r);
            if (raux.first >= aux.first &&
                raux.second <= aux.second) {
               mpheromone[a](j,r) = initial_pheromone;
            } else {
               mpheromone[a](j,r) = 0;
            }
          }
        }
      }
      pheromone.push_back(mpheromone);
      probability.push_back(mprobability);
    }
  }